

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O1

int kex_method_curve25519_key_exchange(LIBSSH2_SESSION *session,key_exchange_state_low_t *key_state)

{
  uchar **ppuVar1;
  size_t *psVar2;
  uint8_t *private_key;
  _func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *p_Var3;
  LIBSSH2_CRYPT_METHOD *pLVar4;
  _LIBSSH2_MAC_METHOD *p_Var5;
  LIBSSH2_COMP_METHOD *pLVar6;
  _func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *p_Var7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  BIGNUM *pBVar21;
  uchar *puVar22;
  uchar *puVar23;
  size_t sVar24;
  char *pcVar25;
  ulong uVar26;
  long lVar27;
  size_t sVar28;
  uchar *server_public_key;
  uchar *local_98;
  uchar *local_90;
  EVP_MD_CTX *ctx;
  uint local_7c;
  uchar *server_host_key;
  size_t server_public_key_len;
  uint local_64;
  uchar *s;
  uchar *local_58;
  ulong local_50;
  size_t *local_48;
  uchar **local_40;
  size_t hostkey_len;
  
  if (key_state->state == libssh2_NB_state_idle) {
    key_state->public_key_oct = (uchar *)0x0;
    key_state->state = libssh2_NB_state_created;
  }
  iVar12 = 0;
  if (key_state->state == libssh2_NB_state_created) {
    s = (uchar *)0x0;
    pcVar25 = session->kex->name;
    iVar12 = strcmp(pcVar25,"curve25519-sha256@libssh.org");
    if ((iVar12 == 0) || (iVar12 = strcmp(pcVar25,"curve25519-sha256"), iVar12 == 0)) {
      iVar12 = _libssh2_curve25519_new
                         (session,&key_state->curve25519_public_key,
                          &key_state->curve25519_private_key);
      if (iVar12 != 0) {
        pcVar25 = "Unable to create private key";
        goto LAB_0010976c;
      }
      key_state->request[0] = '\x1e';
      s = key_state->request + 1;
      _libssh2_store_str(&s,(char *)key_state->curve25519_public_key,0x20);
      key_state->request_len = 0x25;
      key_state->state = libssh2_NB_state_sent;
      bVar11 = true;
      iVar12 = 0;
    }
    else {
      pcVar25 = "Unknown KEX curve25519 curve type";
      iVar12 = -1;
LAB_0010976c:
      iVar12 = _libssh2_error(session,iVar12,pcVar25);
      bVar11 = false;
    }
    if (!bVar11) goto LAB_0010a624;
  }
  if (key_state->state == libssh2_NB_state_sent) {
    iVar13 = _libssh2_transport_send
                       (session,key_state->request,key_state->request_len,(uchar *)0x0,0);
    if (iVar13 == -0x25) {
      return -0x25;
    }
    if (iVar13 == 0) {
      key_state->state = libssh2_NB_state_sent1;
      goto LAB_001097f2;
    }
    pcVar25 = "Unable to send ECDH_INIT";
LAB_001098fb:
    iVar12 = _libssh2_error(session,iVar13,pcVar25);
    goto LAB_0010a624;
  }
LAB_001097f2:
  if (key_state->state == libssh2_NB_state_sent1) {
    iVar13 = _libssh2_packet_require
                       (session,'\x1f',&key_state->data,&key_state->data_len,0,(uchar *)0x0,0,
                        &key_state->req_state);
    if (iVar13 == -0x25) {
      return -0x25;
    }
    if (iVar13 != 0) {
      pcVar25 = "Timeout waiting for ECDH_REPLY reply";
      goto LAB_001098fb;
    }
    key_state->state = libssh2_NB_state_sent2;
  }
  if (key_state->state != libssh2_NB_state_sent2) goto LAB_0010a624;
  uVar26 = key_state->data_len;
  if (uVar26 < 5) {
    iVar12 = _libssh2_error(session,-10,"Data is too short");
  }
  else {
    puVar22 = key_state->data;
    local_98 = key_state->curve25519_public_key;
    private_key = key_state->curve25519_private_key;
    if ((key_state->exchange_state).state == libssh2_NB_state_idle) {
      pBVar21 = BN_new();
      (key_state->exchange_state).k = (BIGNUM *)pBVar21;
      (key_state->exchange_state).state = libssh2_NB_state_created;
    }
    iVar13 = 0;
    if ((key_state->exchange_state).state == libssh2_NB_state_created) {
      local_58 = puVar22 + 1;
      s = puVar22;
      local_50 = uVar26;
      iVar12 = _libssh2_get_string((string_buf *)&s,&server_host_key,&hostkey_len);
      if (iVar12 == 0) {
        session->server_hostkey_len = (uint32_t)hostkey_len;
        puVar22 = (uchar *)(*session->alloc)(hostkey_len & 0xffffffff,&session->abstract);
        session->server_hostkey = puVar22;
        if (puVar22 == (uchar *)0x0) {
          pcVar25 = "Unable to allocate memory for a copy of the host curve25519 key";
LAB_00109a71:
          iVar12 = -6;
          goto LAB_00109a79;
        }
        memcpy(puVar22,(void *)CONCAT44(server_host_key._4_4_,(int)server_host_key),
               (ulong)session->server_hostkey_len);
        iVar12 = _libssh2_md5_init((EVP_MD_CTX **)&server_public_key);
        if ((iVar12 == 0) ||
           (iVar12 = _libssh2_md5_update((EVP_MD_CTX **)&server_public_key,session->server_hostkey,
                                         (ulong)session->server_hostkey_len), iVar12 == 0)) {
LAB_00109989:
          iVar13 = 0;
        }
        else {
          iVar12 = _libssh2_md5_final((EVP_MD_CTX **)&server_public_key,session->server_hostkey_md5)
          ;
          iVar13 = 1;
          if (iVar12 == 0) goto LAB_00109989;
        }
        session->server_hostkey_md5_valid = iVar13;
        iVar12 = _libssh2_sha1_init((EVP_MD_CTX **)&server_public_key);
        if ((iVar12 == 0) ||
           (iVar12 = _libssh2_sha1_update
                               ((EVP_MD_CTX **)&server_public_key,session->server_hostkey,
                                (ulong)session->server_hostkey_len), iVar12 == 0)) {
LAB_001099d6:
          iVar13 = 0;
        }
        else {
          iVar12 = _libssh2_sha1_final((EVP_MD_CTX **)&server_public_key,
                                       session->server_hostkey_sha1);
          iVar13 = 1;
          if (iVar12 == 0) goto LAB_001099d6;
        }
        session->server_hostkey_sha1_valid = iVar13;
        iVar12 = _libssh2_sha256_init((EVP_MD_CTX **)&server_public_key);
        if ((iVar12 == 0) ||
           (iVar12 = _libssh2_sha256_update
                               ((EVP_MD_CTX **)&server_public_key,session->server_hostkey,
                                (ulong)session->server_hostkey_len), iVar12 == 0)) {
LAB_00109a23:
          iVar13 = 0;
        }
        else {
          iVar12 = _libssh2_sha256_final
                             ((EVP_MD_CTX **)&server_public_key,session->server_hostkey_sha256);
          iVar13 = 1;
          if (iVar12 == 0) goto LAB_00109a23;
        }
        session->server_hostkey_sha256_valid = iVar13;
        iVar12 = (*session->hostkey->init)
                           (session,session->server_hostkey,(ulong)session->server_hostkey_len,
                            &session->server_hostkey_abstract);
        if (iVar12 != 0) {
          pcVar25 = "Unable to initialize hostkey importer curve25519";
          goto LAB_00109a60;
        }
        iVar12 = _libssh2_get_string((string_buf *)&s,&server_public_key,&server_public_key_len);
        if (iVar12 != 0) {
          pcVar25 = "Unexpected curve25519 key length";
          goto LAB_001098e7;
        }
        if (CONCAT44(server_public_key_len._4_4_,(uint32_t)server_public_key_len) != 0x20) {
          pcVar25 = "Unexpected curve25519 server public key length";
LAB_00109a60:
          iVar12 = -10;
          goto LAB_00109a79;
        }
        ppuVar1 = &(key_state->exchange_state).h_sig;
        psVar2 = &(key_state->exchange_state).h_sig_len;
        iVar12 = _libssh2_get_string((string_buf *)&s,ppuVar1,psVar2);
        if (iVar12 != 0) {
          pcVar25 = "Unexpected curve25519 server sig length";
          goto LAB_00109a60;
        }
        iVar12 = _libssh2_curve25519_gen_k
                           (&(key_state->exchange_state).k,private_key,
                            (uint8_t *)CONCAT44(server_public_key._4_4_,(int)server_public_key));
        if (iVar12 != 0) {
          pcVar25 = "Unable to create curve25519 shared secret";
          iVar12 = -5;
          goto LAB_00109a79;
        }
        local_48 = psVar2;
        local_40 = ppuVar1;
        iVar13 = BN_num_bits((BIGNUM *)(key_state->exchange_state).k);
        iVar12 = iVar13 + 0xe;
        if (-1 < iVar13 + 7) {
          iVar12 = iVar13 + 7;
        }
        (key_state->exchange_state).k_value_len = (long)((iVar12 >> 3) + 5);
        uVar15 = BN_num_bits((BIGNUM *)(key_state->exchange_state).k);
        if ((uVar15 & 7) != 0) {
          psVar2 = &(key_state->exchange_state).k_value_len;
          *psVar2 = *psVar2 - 1;
        }
        puVar22 = (uchar *)(*session->alloc)((key_state->exchange_state).k_value_len,
                                             &session->abstract);
        (key_state->exchange_state).k_value = puVar22;
        if (puVar22 == (uchar *)0x0) {
          pcVar25 = "Unable to allocate buffer for K";
          goto LAB_00109a71;
        }
        _libssh2_htonu32(puVar22,(int)(key_state->exchange_state).k_value_len - 4);
        uVar15 = BN_num_bits((BIGNUM *)(key_state->exchange_state).k);
        lVar27 = 4;
        if ((uVar15 & 7) == 0) {
          (key_state->exchange_state).k_value[4] = '\0';
          lVar27 = 5;
        }
        BN_bn2bin((BIGNUM *)(key_state->exchange_state).k,
                  (key_state->exchange_state).k_value + lVar27);
        iVar12 = _libssh2_sha256_init(&ctx);
        if (iVar12 == 0) {
LAB_0010aaa8:
          pcVar25 = "Unable to verify hostkey signature curve25519";
          iVar12 = -0xb;
          goto LAB_00109a79;
        }
        (key_state->exchange_state).exchange_hash = &ctx;
        puVar23 = (session->local).banner;
        puVar22 = (key_state->exchange_state).h_sig_comp;
        local_90 = puVar22;
        if (puVar23 == (uchar *)0x0) {
          _libssh2_htonu32(puVar22,0x1a);
          uVar15 = _libssh2_sha256_update(&ctx,puVar22,4);
          local_7c = _libssh2_sha256_update(&ctx,"SSH-2.0-libssh2_1.11.1_DEV",0x1a);
          local_7c = local_7c & uVar15;
        }
        else {
          sVar24 = strlen((char *)puVar23);
          puVar22 = local_90;
          _libssh2_htonu32(local_90,(int)sVar24 - 2);
          uVar15 = _libssh2_sha256_update(&ctx,puVar22,4);
          puVar22 = (session->local).banner;
          sVar24 = strlen((char *)puVar22);
          local_7c = _libssh2_sha256_update(&ctx,puVar22,sVar24 - 2);
          local_7c = local_7c & uVar15;
        }
        local_7c = local_7c & 1;
        sVar24 = strlen((char *)(session->remote).banner);
        puVar23 = local_90;
        _libssh2_htonu32(local_90,(uint32_t)sVar24);
        local_64 = _libssh2_sha256_update(&ctx,puVar23,4);
        puVar22 = (session->remote).banner;
        sVar24 = strlen((char *)puVar22);
        uVar15 = _libssh2_sha256_update(&ctx,puVar22,sVar24);
        uVar15 = uVar15 & local_64;
        _libssh2_htonu32(puVar23,(uint32_t)(session->local).kexinit_len);
        uVar16 = _libssh2_sha256_update(&ctx,puVar23,4);
        uVar17 = _libssh2_sha256_update(&ctx,(session->local).kexinit,(session->local).kexinit_len);
        local_7c = uVar17 & uVar16 & uVar15 & local_7c;
        _libssh2_htonu32(puVar23,(uint32_t)(session->remote).kexinit_len);
        uVar15 = _libssh2_sha256_update(&ctx,puVar23,4);
        uVar16 = _libssh2_sha256_update
                           (&ctx,(session->remote).kexinit,(session->remote).kexinit_len);
        _libssh2_htonu32(puVar23,session->server_hostkey_len);
        uVar17 = _libssh2_sha256_update(&ctx,puVar23,4);
        uVar18 = _libssh2_sha256_update
                           (&ctx,session->server_hostkey,(ulong)session->server_hostkey_len);
        _libssh2_htonu32(puVar23,0x20);
        uVar19 = _libssh2_sha256_update(&ctx,puVar23,4);
        uVar20 = _libssh2_sha256_update(&ctx,local_98,0x20);
        puVar22 = local_90;
        uVar18 = uVar20 & uVar19 & uVar18 & uVar17 & uVar16 & uVar15 & local_7c;
        _libssh2_htonu32(local_90,(uint32_t)server_public_key_len);
        uVar15 = _libssh2_sha256_update(&ctx,puVar22,4);
        uVar16 = _libssh2_sha256_update
                           (&ctx,(void *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                            CONCAT44(server_public_key_len._4_4_,(uint32_t)server_public_key_len));
        uVar17 = _libssh2_sha256_update
                           (&ctx,(key_state->exchange_state).k_value,
                            (key_state->exchange_state).k_value_len);
        if ((((uVar16 & uVar15 & uVar18 & uVar17) == 0) ||
            (iVar12 = _libssh2_sha256_final(&ctx,local_90), iVar12 == 0)) ||
           (iVar12 = (*session->hostkey->sig_verify)
                               (session,*local_40,*local_48,local_90,0x20,
                                &session->server_hostkey_abstract), iVar12 != 0)) goto LAB_0010aaa8;
        (key_state->exchange_state).c = '\x15';
        (key_state->exchange_state).state = libssh2_NB_state_sent;
        bVar11 = true;
        iVar13 = 0;
      }
      else {
        pcVar25 = "Unexpected curve25519 key length 2";
LAB_001098e7:
        iVar12 = -0xe;
LAB_00109a79:
        iVar13 = _libssh2_error(session,iVar12,pcVar25);
        bVar11 = false;
      }
      iVar12 = iVar13;
      if (bVar11) goto LAB_00109a8d;
    }
    else {
LAB_00109a8d:
      if ((key_state->exchange_state).state == libssh2_NB_state_sent) {
        iVar12 = _libssh2_transport_send(session,&(key_state->exchange_state).c,1,(uchar *)0x0,0);
        if (iVar12 == -0x25) goto LAB_0010a608;
        if (iVar12 == 0) {
          (key_state->exchange_state).state = libssh2_NB_state_sent2;
          goto LAB_00109ac5;
        }
        pcVar25 = "Unable to send NEWKEYS message curve25519";
LAB_00109b7f:
        iVar12 = _libssh2_error(session,iVar12,pcVar25);
      }
      else {
LAB_00109ac5:
        iVar12 = iVar13;
        if ((key_state->exchange_state).state == libssh2_NB_state_sent2) {
          ppuVar1 = &(key_state->exchange_state).tmp;
          iVar12 = _libssh2_packet_require
                             (session,'\x15',ppuVar1,&(key_state->exchange_state).tmp_len,0,
                              (uchar *)0x0,0,&(key_state->exchange_state).req_state);
          if (iVar12 == -0x25) goto LAB_0010a608;
          if (iVar12 != 0) {
            pcVar25 = "Timed out waiting for NEWKEYS curve25519";
            goto LAB_00109b7f;
          }
          *(byte *)&session->state = (byte)session->state | 4;
          (*session->free)(*ppuVar1,&session->abstract);
          if (session->session_id == (uchar *)0x0) {
            puVar22 = (uchar *)(*session->alloc)(0x20,&session->abstract);
            session->session_id = puVar22;
            if (puVar22 == (uchar *)0x0) {
              iVar12 = _libssh2_error(session,-6,"Unable to allocate buffer for SHA digest");
              goto LAB_0010a5cc;
            }
            uVar8 = *(undefined8 *)(key_state->exchange_state).h_sig_comp;
            uVar9 = *(undefined8 *)((key_state->exchange_state).h_sig_comp + 8);
            uVar10 = *(undefined8 *)((key_state->exchange_state).h_sig_comp + 0x18);
            *(undefined8 *)(puVar22 + 0x10) =
                 *(undefined8 *)((key_state->exchange_state).h_sig_comp + 0x10);
            *(undefined8 *)(puVar22 + 0x18) = uVar10;
            *(undefined8 *)puVar22 = uVar8;
            *(undefined8 *)(puVar22 + 8) = uVar9;
            session->session_id_len = 0x20;
          }
          p_Var3 = ((session->local).crypt)->dtor;
          if (p_Var3 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
            (*p_Var3)(session,&(session->local).crypt_abstract);
          }
          pLVar4 = (session->local).crypt;
          if (pLVar4->init !=
              (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
               *)0x0) {
            server_public_key._0_4_ = 0;
            server_host_key._0_4_ = 0;
            puVar22 = (uchar *)(*session->alloc)((long)pLVar4->iv_len + 0x20,&session->abstract);
            if (puVar22 == (uchar *)0x0) {
LAB_00109d45:
              puVar22 = (uchar *)0x0;
            }
            else if (((session->local).crypt)->iv_len != 0) {
              local_98 = (key_state->exchange_state).h_sig_comp;
              sVar28 = 0;
              do {
                iVar12 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
                if (((iVar12 == 0) ||
                    (iVar12 = _libssh2_sha256_update
                                        ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                                         (key_state->exchange_state).k_value_len), iVar12 == 0)) ||
                   (iVar12 = _libssh2_sha256_update((EVP_MD_CTX **)&s,local_98,0x20), iVar12 == 0))
                {
LAB_00109d3b:
                  (*session->free)(puVar22,&session->abstract);
                  goto LAB_00109d45;
                }
                uVar26 = sVar28;
                puVar23 = puVar22;
                if (sVar28 == 0) {
                  iVar12 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"A",1);
                  if (iVar12 == 0) goto LAB_00109d3b;
                  uVar26 = (ulong)session->session_id_len;
                  puVar23 = session->session_id;
                }
                iVar12 = _libssh2_sha256_update((EVP_MD_CTX **)&s,puVar23,uVar26);
                if ((iVar12 == 0) ||
                   (iVar12 = _libssh2_sha256_final((EVP_MD_CTX **)&s,puVar22 + sVar28), iVar12 == 0)
                   ) goto LAB_00109d3b;
                sVar28 = sVar28 + 0x20;
              } while (sVar28 < (ulong)(long)((session->local).crypt)->iv_len);
            }
            if (puVar22 == (uchar *)0x0) {
              iVar13 = -1;
              bVar11 = false;
            }
            else {
              puVar23 = (uchar *)(*session->alloc)((long)((session->local).crypt)->secret_len + 0x20
                                                   ,&session->abstract);
              if (puVar23 == (uchar *)0x0) {
LAB_00109e70:
                puVar23 = (uchar *)0x0;
              }
              else if (((session->local).crypt)->secret_len != 0) {
                local_90 = (key_state->exchange_state).h_sig_comp;
                sVar28 = 0;
                local_98 = puVar23;
                do {
                  iVar12 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
                  if (((iVar12 == 0) ||
                      (iVar12 = _libssh2_sha256_update
                                          ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                                           (key_state->exchange_state).k_value_len), iVar12 == 0))
                     || (iVar12 = _libssh2_sha256_update((EVP_MD_CTX **)&s,local_90,0x20),
                        iVar12 == 0)) {
LAB_00109e64:
                    (*session->free)(local_98,&session->abstract);
                    goto LAB_00109e70;
                  }
                  uVar26 = sVar28;
                  puVar23 = local_98;
                  if (sVar28 == 0) {
                    iVar12 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"C",1);
                    if (iVar12 == 0) goto LAB_00109e64;
                    uVar26 = (ulong)session->session_id_len;
                    puVar23 = session->session_id;
                  }
                  iVar12 = _libssh2_sha256_update((EVP_MD_CTX **)&s,puVar23,uVar26);
                  if ((iVar12 == 0) ||
                     (iVar12 = _libssh2_sha256_final((EVP_MD_CTX **)&s,local_98 + sVar28),
                     iVar12 == 0)) goto LAB_00109e64;
                  sVar28 = sVar28 + 0x20;
                  puVar23 = local_98;
                } while (sVar28 < (ulong)(long)((session->local).crypt)->secret_len);
              }
              if (puVar23 == (uchar *)0x0) {
LAB_00109ebe:
                puVar23 = puVar22;
                bVar11 = false;
                iVar13 = -5;
              }
              else {
                pLVar4 = (session->local).crypt;
                iVar12 = (*pLVar4->init)(session,pLVar4,puVar22,(int *)&server_public_key,puVar23,
                                         (int *)&server_host_key,1,&(session->local).crypt_abstract)
                ;
                if (iVar12 != 0) {
                  (*session->free)(puVar22,&session->abstract);
                  puVar22 = puVar23;
                  goto LAB_00109ebe;
                }
                if ((int)server_public_key != 0) {
                  explicit_bzero(puVar22,(long)((session->local).crypt)->iv_len);
                  (*session->free)(puVar22,&session->abstract);
                }
                if ((int)server_host_key == 0) {
                  bVar11 = true;
                  goto LAB_00109ece;
                }
                explicit_bzero(puVar23,(long)((session->local).crypt)->secret_len);
                bVar11 = true;
              }
              (*session->free)(puVar23,&session->abstract);
            }
LAB_00109ece:
            iVar12 = iVar13;
            if (!bVar11) goto LAB_0010a5cc;
          }
          p_Var3 = ((session->remote).crypt)->dtor;
          if (p_Var3 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
            (*p_Var3)(session,&(session->remote).crypt_abstract);
          }
          pLVar4 = (session->remote).crypt;
          if (pLVar4->init !=
              (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
               *)0x0) {
            server_public_key._0_4_ = 0;
            server_host_key._0_4_ = 0;
            puVar22 = (uchar *)(*session->alloc)((long)pLVar4->iv_len + 0x20,&session->abstract);
            if (puVar22 == (uchar *)0x0) {
LAB_0010a009:
              puVar22 = (uchar *)0x0;
            }
            else if (((session->remote).crypt)->iv_len != 0) {
              local_98 = (key_state->exchange_state).h_sig_comp;
              sVar28 = 0;
              do {
                iVar12 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
                if (((iVar12 == 0) ||
                    (iVar12 = _libssh2_sha256_update
                                        ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                                         (key_state->exchange_state).k_value_len), iVar12 == 0)) ||
                   (iVar12 = _libssh2_sha256_update((EVP_MD_CTX **)&s,local_98,0x20), iVar12 == 0))
                {
LAB_00109fff:
                  (*session->free)(puVar22,&session->abstract);
                  goto LAB_0010a009;
                }
                uVar26 = sVar28;
                puVar23 = puVar22;
                if (sVar28 == 0) {
                  iVar12 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"B",1);
                  if (iVar12 == 0) goto LAB_00109fff;
                  uVar26 = (ulong)session->session_id_len;
                  puVar23 = session->session_id;
                }
                iVar12 = _libssh2_sha256_update((EVP_MD_CTX **)&s,puVar23,uVar26);
                if ((iVar12 == 0) ||
                   (iVar12 = _libssh2_sha256_final((EVP_MD_CTX **)&s,puVar22 + sVar28), iVar12 == 0)
                   ) goto LAB_00109fff;
                sVar28 = sVar28 + 0x20;
              } while (sVar28 < (ulong)(long)((session->remote).crypt)->iv_len);
            }
            if (puVar22 == (uchar *)0x0) {
              iVar13 = -5;
              bVar11 = false;
            }
            else {
              puVar23 = (uchar *)(*session->alloc)((long)((session->remote).crypt)->secret_len +
                                                   0x20,&session->abstract);
              if (puVar23 == (uchar *)0x0) {
LAB_0010a19f:
                puVar23 = (uchar *)0x0;
              }
              else if (((session->remote).crypt)->secret_len != 0) {
                local_90 = (key_state->exchange_state).h_sig_comp;
                sVar28 = 0;
                local_98 = puVar23;
                do {
                  iVar12 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
                  if (((iVar12 == 0) ||
                      (iVar12 = _libssh2_sha256_update
                                          ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                                           (key_state->exchange_state).k_value_len), iVar12 == 0))
                     || (iVar12 = _libssh2_sha256_update((EVP_MD_CTX **)&s,local_90,0x20),
                        iVar12 == 0)) {
LAB_0010a193:
                    (*session->free)(local_98,&session->abstract);
                    goto LAB_0010a19f;
                  }
                  uVar26 = sVar28;
                  puVar23 = local_98;
                  if (sVar28 == 0) {
                    iVar12 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"D",1);
                    if (iVar12 == 0) goto LAB_0010a193;
                    uVar26 = (ulong)session->session_id_len;
                    puVar23 = session->session_id;
                  }
                  iVar12 = _libssh2_sha256_update((EVP_MD_CTX **)&s,puVar23,uVar26);
                  if ((iVar12 == 0) ||
                     (iVar12 = _libssh2_sha256_final((EVP_MD_CTX **)&s,local_98 + sVar28),
                     iVar12 == 0)) goto LAB_0010a193;
                  sVar28 = sVar28 + 0x20;
                  puVar23 = local_98;
                } while (sVar28 < (ulong)(long)((session->remote).crypt)->secret_len);
              }
              if (puVar23 == (uchar *)0x0) {
LAB_0010a1ed:
                puVar23 = puVar22;
                bVar11 = false;
                iVar13 = -5;
              }
              else {
                pLVar4 = (session->remote).crypt;
                iVar12 = (*pLVar4->init)(session,pLVar4,puVar22,(int *)&server_public_key,puVar23,
                                         (int *)&server_host_key,0,&(session->remote).crypt_abstract
                                        );
                if (iVar12 != 0) {
                  (*session->free)(puVar22,&session->abstract);
                  puVar22 = puVar23;
                  goto LAB_0010a1ed;
                }
                if ((int)server_public_key != 0) {
                  explicit_bzero(puVar22,(long)((session->remote).crypt)->iv_len);
                  (*session->free)(puVar22,&session->abstract);
                }
                if ((int)server_host_key == 0) {
                  bVar11 = true;
                  goto LAB_0010a1fd;
                }
                explicit_bzero(puVar23,(long)((session->remote).crypt)->secret_len);
                bVar11 = true;
              }
              (*session->free)(puVar23,&session->abstract);
            }
LAB_0010a1fd:
            iVar12 = iVar13;
            if (!bVar11) goto LAB_0010a5cc;
          }
          p_Var3 = ((session->local).mac)->dtor;
          if (p_Var3 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
            (*p_Var3)(session,&(session->local).mac_abstract);
          }
          p_Var5 = (session->local).mac;
          if (p_Var5->init != (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
            server_public_key._0_4_ = 0;
            puVar22 = (uchar *)(*session->alloc)((long)p_Var5->key_len + 0x20,&session->abstract);
            if (puVar22 == (uchar *)0x0) {
LAB_0010a336:
              puVar22 = (uchar *)0x0;
            }
            else if (((session->local).mac)->key_len != 0) {
              local_98 = (key_state->exchange_state).h_sig_comp;
              sVar28 = 0;
              do {
                iVar12 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
                if (((iVar12 == 0) ||
                    (iVar12 = _libssh2_sha256_update
                                        ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                                         (key_state->exchange_state).k_value_len), iVar12 == 0)) ||
                   (iVar12 = _libssh2_sha256_update((EVP_MD_CTX **)&s,local_98,0x20), iVar12 == 0))
                {
LAB_0010a32c:
                  (*session->free)(puVar22,&session->abstract);
                  goto LAB_0010a336;
                }
                uVar26 = sVar28;
                puVar23 = puVar22;
                if (sVar28 == 0) {
                  iVar12 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"E",1);
                  if (iVar12 == 0) goto LAB_0010a32c;
                  uVar26 = (ulong)session->session_id_len;
                  puVar23 = session->session_id;
                }
                iVar12 = _libssh2_sha256_update((EVP_MD_CTX **)&s,puVar23,uVar26);
                if ((iVar12 == 0) ||
                   (iVar12 = _libssh2_sha256_final((EVP_MD_CTX **)&s,puVar22 + sVar28), iVar12 == 0)
                   ) goto LAB_0010a32c;
                sVar28 = sVar28 + 0x20;
              } while (sVar28 < (ulong)(long)((session->local).mac)->key_len);
            }
            if (puVar22 == (uchar *)0x0) {
              iVar13 = -5;
            }
            else {
              (*((session->local).mac)->init)
                        (session,puVar22,(int *)&server_public_key,&(session->local).mac_abstract);
              if ((int)server_public_key != 0) {
                explicit_bzero(puVar22,(long)((session->local).mac)->key_len);
                (*session->free)(puVar22,&session->abstract);
              }
            }
            iVar12 = iVar13;
            if (puVar22 == (uchar *)0x0) goto LAB_0010a5cc;
          }
          p_Var3 = ((session->remote).mac)->dtor;
          if (p_Var3 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
            (*p_Var3)(session,&(session->remote).mac_abstract);
          }
          p_Var5 = (session->remote).mac;
          if (p_Var5->init != (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
            server_public_key._0_4_ = 0;
            puVar22 = (uchar *)(*session->alloc)((long)p_Var5->key_len + 0x20,&session->abstract);
            if (puVar22 == (uchar *)0x0) {
LAB_0010a4c1:
              puVar22 = (uchar *)0x0;
            }
            else if (((session->remote).mac)->key_len != 0) {
              local_98 = (key_state->exchange_state).h_sig_comp;
              sVar28 = 0;
              do {
                iVar12 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
                if (((iVar12 == 0) ||
                    (iVar12 = _libssh2_sha256_update
                                        ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                                         (key_state->exchange_state).k_value_len), iVar12 == 0)) ||
                   (iVar12 = _libssh2_sha256_update((EVP_MD_CTX **)&s,local_98,0x20), iVar12 == 0))
                {
LAB_0010a4b7:
                  (*session->free)(puVar22,&session->abstract);
                  goto LAB_0010a4c1;
                }
                uVar26 = sVar28;
                puVar23 = puVar22;
                if (sVar28 == 0) {
                  iVar12 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"F",1);
                  if (iVar12 == 0) goto LAB_0010a4b7;
                  uVar26 = (ulong)session->session_id_len;
                  puVar23 = session->session_id;
                }
                iVar12 = _libssh2_sha256_update((EVP_MD_CTX **)&s,puVar23,uVar26);
                if ((iVar12 == 0) ||
                   (iVar12 = _libssh2_sha256_final((EVP_MD_CTX **)&s,puVar22 + sVar28), iVar12 == 0)
                   ) goto LAB_0010a4b7;
                sVar28 = sVar28 + 0x20;
              } while (sVar28 < (ulong)(long)((session->remote).mac)->key_len);
            }
            if (puVar22 == (uchar *)0x0) {
              iVar13 = -5;
            }
            else {
              (*((session->remote).mac)->init)
                        (session,puVar22,(int *)&server_public_key,&(session->remote).mac_abstract);
              if ((int)server_public_key != 0) {
                explicit_bzero(puVar22,(long)((session->remote).mac)->key_len);
                (*session->free)(puVar22,&session->abstract);
              }
            }
            iVar12 = iVar13;
            if (puVar22 == (uchar *)0x0) goto LAB_0010a5cc;
          }
          pLVar6 = (session->local).comp;
          if ((pLVar6 != (LIBSSH2_COMP_METHOD *)0x0) &&
             (p_Var7 = pLVar6->dtor, p_Var7 != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0
             )) {
            (*p_Var7)(session,1,&(session->local).comp_abstract);
          }
          pLVar6 = (session->local).comp;
          if ((pLVar6 != (LIBSSH2_COMP_METHOD *)0x0) &&
             (p_Var7 = pLVar6->init, p_Var7 != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0
             )) {
            iVar14 = (*p_Var7)(session,1,&(session->local).comp_abstract);
            iVar12 = -5;
            if (iVar14 != 0) goto LAB_0010a5cc;
          }
          pLVar6 = (session->remote).comp;
          if ((pLVar6 != (LIBSSH2_COMP_METHOD *)0x0) &&
             (p_Var7 = pLVar6->dtor, p_Var7 != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0
             )) {
            (*p_Var7)(session,0,&(session->remote).comp_abstract);
          }
          pLVar6 = (session->remote).comp;
          iVar12 = iVar13;
          if ((pLVar6 != (LIBSSH2_COMP_METHOD *)0x0) &&
             (p_Var7 = pLVar6->init, p_Var7 != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0
             )) {
            iVar14 = (*p_Var7)(session,0,&(session->remote).comp_abstract);
            iVar12 = -5;
            if (iVar14 == 0) {
              iVar12 = iVar13;
            }
          }
        }
      }
    }
LAB_0010a5cc:
    BN_clear_free((BIGNUM *)(key_state->exchange_state).k);
    (key_state->exchange_state).k = (BIGNUM *)0x0;
    puVar22 = (key_state->exchange_state).k_value;
    if (puVar22 != (uchar *)0x0) {
      (*session->free)(puVar22,&session->abstract);
      (key_state->exchange_state).k_value = (uchar *)0x0;
    }
    (key_state->exchange_state).state = libssh2_NB_state_idle;
  }
LAB_0010a608:
  if (iVar12 == -0x25) {
    return -0x25;
  }
  (*session->free)(key_state->data,&session->abstract);
LAB_0010a624:
  if (key_state->curve25519_public_key != (uchar *)0x0) {
    explicit_bzero(key_state->curve25519_public_key,0x20);
    (*session->free)(key_state->curve25519_public_key,&session->abstract);
    key_state->curve25519_public_key = (uchar *)0x0;
  }
  if (key_state->curve25519_private_key != (uchar *)0x0) {
    explicit_bzero(key_state->curve25519_private_key,0x20);
    (*session->free)(key_state->curve25519_private_key,&session->abstract);
    key_state->curve25519_private_key = (uchar *)0x0;
  }
  key_state->state = libssh2_NB_state_idle;
  return iVar12;
}

Assistant:

static int
kex_method_curve25519_key_exchange
(LIBSSH2_SESSION * session, key_exchange_state_low_t * key_state)
{
    int ret = 0;
    int rc = 0;

    if(key_state->state == libssh2_NB_state_idle) {

        key_state->public_key_oct = NULL;
        key_state->state = libssh2_NB_state_created;
    }

    if(key_state->state == libssh2_NB_state_created) {
        unsigned char *s = NULL;

        rc = strcmp(session->kex->name, "curve25519-sha256@libssh.org");
        if(rc)
            rc = strcmp(session->kex->name, "curve25519-sha256");

        if(rc) {
            ret = _libssh2_error(session, -1,
                                 "Unknown KEX curve25519 curve type");
            goto clean_exit;
        }

        rc = _libssh2_curve25519_new(session,
                                     &key_state->curve25519_public_key,
                                     &key_state->curve25519_private_key);

        if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to create private key");
            goto clean_exit;
        }

        key_state->request[0] = SSH2_MSG_KEX_ECDH_INIT;
        s = key_state->request + 1;
        _libssh2_store_str(&s, (const char *)key_state->curve25519_public_key,
                           LIBSSH2_ED25519_KEY_LEN);
        key_state->request_len = LIBSSH2_ED25519_KEY_LEN + 5;

        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Initiating curve25519 SHA2"));

        key_state->state = libssh2_NB_state_sent;
    }

    if(key_state->state == libssh2_NB_state_sent) {
        rc = _libssh2_transport_send(session, key_state->request,
                                     key_state->request_len, NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to send ECDH_INIT");
            goto clean_exit;
        }

        key_state->state = libssh2_NB_state_sent1;
    }

    if(key_state->state == libssh2_NB_state_sent1) {
        rc = _libssh2_packet_require(session, SSH2_MSG_KEX_ECDH_REPLY,
                                     &key_state->data, &key_state->data_len,
                                     0, NULL, 0, &key_state->req_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Timeout waiting for ECDH_REPLY reply");
            goto clean_exit;
        }

        key_state->state = libssh2_NB_state_sent2;
    }

    if(key_state->state == libssh2_NB_state_sent2) {

        ret = curve25519_sha256(session, key_state->data, key_state->data_len,
                                key_state->curve25519_public_key,
                                key_state->curve25519_private_key,
                                &key_state->exchange_state);

        if(ret == LIBSSH2_ERROR_EAGAIN) {
            return ret;
        }

        LIBSSH2_FREE(session, key_state->data);
    }

clean_exit:

    if(key_state->curve25519_public_key) {
        _libssh2_explicit_zero(key_state->curve25519_public_key,
                               LIBSSH2_ED25519_KEY_LEN);
        LIBSSH2_FREE(session, key_state->curve25519_public_key);
        key_state->curve25519_public_key = NULL;
    }

    if(key_state->curve25519_private_key) {
        _libssh2_explicit_zero(key_state->curve25519_private_key,
                               LIBSSH2_ED25519_KEY_LEN);
        LIBSSH2_FREE(session, key_state->curve25519_private_key);
        key_state->curve25519_private_key = NULL;
    }

    key_state->state = libssh2_NB_state_idle;

    return ret;
}